

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void deseason_ma(double *sig,int N,int s,double *oup)

{
  size_t __size;
  int iVar1;
  int iVar2;
  double *oup_00;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  oup_00 = (double *)malloc((long)N * 8);
  __size = (long)s * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  mafilter2(sig,N,s,oup_00);
  iVar1 = s / 2;
  iVar2 = iVar1 * 2;
  if (iVar2 != s) {
    iVar1 = (s + -1) / 2;
    iVar2 = iVar1 * 2;
  }
  uVar5 = 0;
  uVar4 = 0;
  if (0 < s) {
    uVar4 = (ulong)(uint)s;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    dVar6 = 0.0;
    dVar7 = 0.0;
    for (uVar3 = uVar5; (long)uVar3 < (long)(N - iVar2); uVar3 = uVar3 + (long)s) {
      dVar7 = (dVar7 + sig[(long)iVar1 + uVar3]) - oup_00[(long)iVar1 + uVar3];
      dVar6 = dVar6 + 1.0;
    }
    *(double *)((long)__ptr + (long)((iVar1 + (int)uVar5) % s) * 8) = dVar7 / dVar6;
  }
  dVar6 = 0.0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    dVar6 = dVar6 + *(double *)((long)__ptr + uVar5 * 8);
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    *(double *)((long)__ptr_00 + uVar5 * 8) =
         *(double *)((long)__ptr + uVar5 * 8) - dVar6 / (double)s;
  }
  uVar5 = 0;
  iVar2 = s;
  uVar4 = (ulong)(uint)N;
  if (N < 1) {
    uVar4 = uVar5;
  }
  for (; iVar1 = iVar2, uVar5 != uVar4; uVar5 = uVar5 + 1) {
    do {
      iVar1 = iVar1 - s;
    } while (s <= iVar1);
    oup[uVar5] = sig[uVar5] - *(double *)((long)__ptr_00 + (long)iVar1 * 8);
    iVar2 = iVar2 + 1;
  }
  free(__ptr);
  free(__ptr_00);
  free(oup_00);
  return;
}

Assistant:

void deseason_ma(double *sig,int N,int s,double *oup) {
	double *mt,*w,*seas;
	int k,window,q,odd,jd,count,per,it;
	double temp,wi;
	
	window = s;
	mt = (double*) malloc(sizeof(double) * N);	
	w = (double*) malloc(sizeof(double) * window);	
	seas = (double*) malloc(sizeof(double) * window);
	
	mafilter2(sig,N,window,mt);
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	for(k = 0; k < window;++k) {
		jd = k;
		count = 0;
		temp = 0.0;
		while (jd < N - 2*q) {
			temp = temp + sig[q+jd]-mt[q+jd];
			count++;
			jd+=window;
		}
		per = k + q -((k+q)/window)*window;
		w[per] = temp/count;
	}
	
	temp = 0.0;
	for(k = 0; k < window;++k)  {
		temp += w[k];
	}
	wi = temp/window;
	
	for(k = 0; k < window;++k)  {
		seas[k] = w[k] - wi;
	}
	
	for(k = 0; k < N;++k) {
		it = k;
		while (it >= window) {
			it -= window;
		}
		oup[k] = sig[k] - seas[it];
	}
	
	free(w);
	free(seas);
	free(mt);
}